

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void row_numberValueFunc(sqlite3_context *pCtx)

{
  i64 *piVar1;
  undefined8 local_28;
  i64 *p;
  sqlite3_context *pCtx_local;
  
  piVar1 = (i64 *)sqlite3_aggregate_context(pCtx,8);
  if (piVar1 == (i64 *)0x0) {
    local_28 = 0;
  }
  else {
    local_28 = *piVar1;
  }
  sqlite3_result_int64(pCtx,local_28);
  return;
}

Assistant:

static void row_numberValueFunc(sqlite3_context *pCtx){
  i64 *p = (i64*)sqlite3_aggregate_context(pCtx, sizeof(*p));
  sqlite3_result_int64(pCtx, (p ? *p : 0));
}